

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

cmFileList * __thiscall cmFileList::operator/(cmFileList *this,cmFileListGeneratorBase *rhs)

{
  auto_ptr<cmFileListGeneratorBase> aVar1;
  cmFileListGeneratorBase *pcVar2;
  auto_ptr<cmFileListGeneratorBase> local_20;
  
  if (this->Last == (cmFileListGeneratorBase *)0x0) {
    (*rhs->_vptr_cmFileListGeneratorBase[3])(&local_20);
    aVar1.x_ = local_20.x_;
    local_20.x_ = (cmFileListGeneratorBase *)0x0;
    pcVar2 = (this->First).x_;
    if (pcVar2 != aVar1.x_) {
      if (pcVar2 != (cmFileListGeneratorBase *)0x0) {
        (*pcVar2->_vptr_cmFileListGeneratorBase[1])();
      }
      (this->First).x_ = aVar1.x_;
    }
    if (local_20.x_ != (cmFileListGeneratorBase *)0x0) {
      (*(local_20.x_)->_vptr_cmFileListGeneratorBase[1])();
    }
    pcVar2 = (this->First).x_;
  }
  else {
    pcVar2 = cmFileListGeneratorBase::SetNext(this->Last,rhs);
  }
  this->Last = pcVar2;
  return this;
}

Assistant:

cmFileList& operator/(cmFileListGeneratorBase const& rhs)
  {
    if (this->Last) {
      this->Last = this->Last->SetNext(rhs);
    } else {
      this->First = rhs.Clone();
      this->Last = this->First.get();
    }
    return *this;
  }